

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O0

void __thiscall
JointPolicyPureVector::JointPolicyPureVector
          (JointPolicyPureVector *this,I_PtPDpure_constPtr *pu,PolicyDomainCategory idc)

{
  PolicyDomainCategory in_EDX;
  shared_ptr *in_RSI;
  JointPolicyDiscretePure *in_RDI;
  
  JointPolicyDiscretePure::JointPolicyDiscretePure(in_RDI,in_RSI,in_EDX);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(in_RDI + 0x38),in_RSI,in_EDX,999999);
  *(undefined **)in_RDI = &JointPolicyDiscretePure::typeinfo;
  *(undefined8 **)(in_RDI + 0x38) = &ArgumentHandlers::globalOptions_child;
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::vector
            ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)0x13a905);
  return;
}

Assistant:

JointPolicyPureVector(I_PtPDpure_constPtr pu,
                              PolicyGlobals::PolicyDomainCategory idc )
            :
            JointPolicyDiscretePure(pu, idc),
            JPolComponent_VectorImplementation(pu, idc)
        {}